

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::genDataHandler(CppGenerator *this)

{
  ostream *poVar1;
  size_t sVar2;
  TDNode *__rhs;
  ulong relationID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  ofstream ofs;
  
  std::__cxx11::string::string
            ((string *)&local_3b0,"#ifndef INCLUDE_DATAHANDLER_HPP_\n",(allocator *)&local_330);
  std::operator+(&local_390,&local_3b0,"#define INCLUDE_DATAHANDLER_HPP_\n\n");
  std::operator+(&local_370,&local_390,"#include <algorithm>\n");
  std::operator+(&local_350,&local_370,"#include <chrono>\n");
  std::operator+(&local_3f0,&local_350,"#include <cstring>\n");
  std::operator+(&local_3d0,&local_3f0,"#include <fstream>\n");
  std::operator+(&local_410,&local_3d0,"#include <iostream>\n");
  std::operator+(&local_430,&local_410,"#include <thread>\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 &local_430,"#include <unordered_map>\n");
  std::operator+(&header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 "#include <vector>\n\n");
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  if (multifaq::cppgen::MICRO_BENCH == '\x01') {
    offset_abi_cxx11_(&local_2d0,this,1);
    std::operator+(&local_2f0,"#define INIT_MICRO_BENCH(timer)\\\n",&local_2d0);
    std::operator+(&local_330,&local_2f0,
                   "auto begin_##timer = std::chrono::high_resolution_clock::now();\\\n");
    offset_abi_cxx11_(&local_250,this,1);
    std::operator+(&local_3b0,&local_330,&local_250);
    std::operator+(&local_390,&local_3b0,
                   "auto finish_##timer = std::chrono::high_resolution_clock::now();\\\n");
    offset_abi_cxx11_(&local_270,this,1);
    std::operator+(&local_370,&local_390,&local_270);
    std::operator+(&local_350,&local_370,"std::chrono::duration<double>  elapsed_##timer = ");
    std::operator+(&local_3f0,&local_350,"finish_##timer - begin_##timer;\\\n");
    offset_abi_cxx11_(&local_290,this,1);
    std::operator+(&local_3d0,&local_3f0,&local_290);
    std::operator+(&local_410,&local_3d0,"double time_spent_##timer = elapsed_##timer.count();\\\n")
    ;
    offset_abi_cxx11_(&local_2b0,this,1);
    std::operator+(&local_430,&local_410,&local_2b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &local_430,"double global_time_##timer = 0;\n");
    std::__cxx11::string::append((string *)&header);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string
              ((string *)&local_430,"#define BEGIN_MICRO_BENCH(timer) begin_##timer = ",
               (allocator *)&local_410);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &local_430,"std::chrono::high_resolution_clock::now();\n");
    std::__cxx11::string::append((string *)&header);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::string
              ((string *)&local_390,"#define END_MICRO_BENCH(timer) finish_##timer = ",
               (allocator *)&local_2d0);
    std::operator+(&local_370,&local_390,"std::chrono::high_resolution_clock::now();\\\n");
    offset_abi_cxx11_(&local_3b0,this,1);
    std::operator+(&local_350,&local_370,&local_3b0);
    std::operator+(&local_3f0,&local_350,"elapsed_##timer = finish_##timer - begin_##timer;\\\n");
    offset_abi_cxx11_(&local_330,this,1);
    std::operator+(&local_3d0,&local_3f0,&local_330);
    std::operator+(&local_410,&local_3d0,"time_spent_##timer = elapsed_##timer.count();\\\n");
    offset_abi_cxx11_(&local_2f0,this,1);
    std::operator+(&local_430,&local_410,&local_2f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &local_430,"global_time_##timer += time_spent_##timer;\n");
    std::__cxx11::string::append((string *)&header);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::string
              ((string *)&local_430,"#define PRINT_MICRO_BENCH(timer) std::cout << ",
               (allocator *)&local_410);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &local_430,
                   "#timer << \": \" << std::to_string(global_time_##timer) << std::endl;\n\n");
    std::__cxx11::string::append((string *)&header);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&local_430);
  }
  offset_abi_cxx11_(&local_3f0,this,1);
  std::operator+(&local_3d0,"using namespace std::chrono;\n\nnamespace lmfao\n{\n",&local_3f0);
  std::operator+(&local_410,&local_3d0,"const std::string PATH_TO_DATA = \"");
  std::operator+(&local_430,&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 &local_430,"\";\n\n");
  std::__cxx11::string::append((string *)&header);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::operator+(&local_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"DataHandler.h");
  std::ofstream::ofstream(&ofs,(string *)&local_430,_S_out);
  std::__cxx11::string::~string((string *)&local_430);
  poVar1 = std::operator<<((ostream *)&ofs,(string *)&header);
  genTupleStructs_abi_cxx11_(&local_430,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_430);
  genCaseIdentifiers_abi_cxx11_(&local_410,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_410);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  relationID = 0;
  while( true ) {
    sVar2 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar2 <= relationID) break;
    offset_abi_cxx11_(&local_3f0,this,1);
    std::operator+(&local_3d0,&local_3f0,"extern void sort");
    __rhs = TreeDecomposition::getRelation
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,relationID);
    std::operator+(&local_410,&local_3d0,&__rhs->_name);
    std::operator+(&local_430,&local_410,"();\n");
    std::operator<<((ostream *)&ofs,(string *)&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    relationID = relationID + 1;
  }
  std::operator<<((ostream *)&ofs,"}\n\n#endif /* INCLUDE_DATAHANDLER_HPP_*/\n");
  std::ofstream::close();
  std::operator+(&local_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"DataHandler.cpp");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  genTupleStructConstructors_abi_cxx11_(&local_430,this);
  poVar1 = std::operator<<((ostream *)&ofs,(string *)&local_430);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_430);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&header);
  return;
}

Assistant:

void CppGenerator::genDataHandler()
{
    std::string header = std::string("#ifndef INCLUDE_DATAHANDLER_HPP_\n")+
        "#define INCLUDE_DATAHANDLER_HPP_\n\n"+
        "#include <algorithm>\n"+
        "#include <chrono>\n"+
        "#include <cstring>\n"+
        "#include <fstream>\n"+
        "#include <iostream>\n" +
        "#include <thread>\n" +
        "#include <unordered_map>\n" +
        "#include <vector>\n\n";

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
    header += "#include <parallel/algorithm>\n";
#endif

    if (MICRO_BENCH)
    {
        header += "#define INIT_MICRO_BENCH(timer)\\\n"+offset(1)+
            "auto begin_##timer = std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+
            "auto finish_##timer = std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+"std::chrono::duration<double>  elapsed_##timer = "+
            "finish_##timer - begin_##timer;\\\n"+
            offset(1)+"double time_spent_##timer = elapsed_##timer.count();\\\n"+
            offset(1)+"double global_time_##timer = 0;\n";

        header += std::string("#define BEGIN_MICRO_BENCH(timer) begin_##timer = ")+
            "std::chrono::high_resolution_clock::now();\n";
        header += std::string("#define END_MICRO_BENCH(timer) finish_##timer = ")+
            "std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+"elapsed_##timer = finish_##timer - begin_##timer;\\\n"+
            offset(1)+"time_spent_##timer = elapsed_##timer.count();\\\n"+
            offset(1)+"global_time_##timer += time_spent_##timer;\n";

        header += std::string("#define PRINT_MICRO_BENCH(timer) std::cout << ")+
            "#timer << \": \" << std::to_string(global_time_##timer) << std::endl;\n\n";
    }
    
    header += "using namespace std::chrono;\n\nnamespace lmfao\n{\n"+
        offset(1)+"const std::string PATH_TO_DATA = \""+PATH_TO_DATA+"\";\n\n";

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"DataHandler.h", std::ofstream::out);

    ofs << header << genTupleStructs() << genCaseIdentifiers() << std::endl;

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
        ofs << offset(1)+"extern void sort"+_td->getRelation(relID)->_name+"();\n";
    
    ofs <<  "}\n\n#endif /* INCLUDE_DATAHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DataHandler.cpp", std::ofstream::out);
    ofs << genTupleStructConstructors() << std::endl;
    ofs.close();
}